

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O0

void __thiscall
charls::process_transformed<charls::transform_none<unsigned_short>_>::~process_transformed
          (process_transformed<charls::transform_none<unsigned_short>_> *this)

{
  process_transformed<charls::transform_none<unsigned_short>_> *this_local;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->buffer_);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector(&this->temp_line_);
  charls::process_line::~process_line(&this->super_process_line);
  return;
}

Assistant:

process_transformed(byte_span source_pixels, const size_t stride, const frame_info& info,
                        const coding_parameters& parameters, TransformType transform) :
        frame_info_{info},
        parameters_{parameters},
        stride_{stride},
        temp_line_(static_cast<size_t>(info.component_count) * info.width),
        buffer_(static_cast<size_t>(info.component_count) * info.width * sizeof(size_type)),
        transform_{transform},
        inverse_transform_{transform},
        raw_pixels_{source_pixels},
        mask_{(1U << info.bits_per_sample) - 1U}
    {
    }